

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SPIREntryPoint * __thiscall
spirv_cross::Compiler::get_first_entry_point(Compiler *this,string *name)

{
  __type _Var1;
  CompilerError *this_00;
  __node_base *p_Var2;
  allocator local_129;
  pair<unsigned_int,_spirv_cross::SPIREntryPoint> local_128;
  
  p_Var2 = &(this->ir).entry_points._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_128,"Entry point does not exist.",&local_129);
      CompilerError::CompilerError(this_00,(string *)&local_128);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::pair<unsigned_int,_spirv_cross::SPIREntryPoint>::
    pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_true>
              (&local_128,
               (pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>
                *)(p_Var2 + 1));
    _Var1 = ::std::operator==(&local_128.second.orig_name,name);
    SPIREntryPoint::~SPIREntryPoint(&local_128.second);
  } while (!_Var1);
  return (SPIREntryPoint *)(p_Var2 + 2);
}

Assistant:

SPIREntryPoint &Compiler::get_first_entry_point(const std::string &name)
{
	auto itr = find_if(
	    begin(ir.entry_points), end(ir.entry_points),
	    [&](const std::pair<uint32_t, SPIREntryPoint> &entry) -> bool { return entry.second.orig_name == name; });

	if (itr == end(ir.entry_points))
		SPIRV_CROSS_THROW("Entry point does not exist.");

	return itr->second;
}